

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O3

bool __thiscall
tonk::ConnectionMap<unsigned_int,_tonk::UInt32Hasher>::Remove
          (ConnectionMap<unsigned_int,_tonk::UInt32Hasher> *this,uint *key,IConnection *conn)

{
  uint uVar1;
  raw_node *prVar2;
  uint uVar3;
  raw_node *prVar4;
  raw_node *prVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar15;
  raw_node *prVar16;
  uint8_t uVar17;
  raw_node *prVar18;
  ulong uVar14;
  
  uVar12 = (this->TheMap).m_num_valid;
  if (uVar12 == 0) {
    return false;
  }
  uVar13 = *key;
  uVar1 = (this->TheMap).m_hash_shift;
  uVar15 = uVar13 * -0x61c88647 >> (uVar1 & 0x1f);
  uVar9 = (ulong)uVar15;
  prVar2 = (this->TheMap).m_values;
  if (prVar2[uVar9].m_bits[0x10] != '\0') {
    prVar18 = prVar2 + uVar9;
    if (*(uint *)prVar18->m_bits != uVar13) {
      uVar6 = (this->TheMap).m_values_count - 1;
      do {
        iVar7 = (int)uVar9;
        uVar3 = iVar7 - 1;
        if (iVar7 == 0) {
          uVar3 = uVar6;
        }
        uVar9 = (ulong)uVar3;
        prVar18 = prVar18 + -1;
        if (iVar7 == 0) {
          prVar18 = prVar2 + uVar6;
        }
        if (uVar3 == uVar15) {
          return false;
        }
        if (prVar18->m_bits[0x10] == '\0') {
          return false;
        }
      } while (*(uint *)prVar18->m_bits != uVar13);
    }
    iVar7 = (int)uVar9;
    if ((-1 < iVar7) && (*(IConnection **)(prVar2[uVar9].m_bits + 8) == conn)) {
      prVar18 = prVar2 + uVar9;
      prVar18->m_bits[0x10] = '\0';
      (this->TheMap).m_num_valid = uVar12 - 1;
      uVar12 = (this->TheMap).m_values_count - 1;
      uVar14 = (ulong)uVar12;
      prVar16 = prVar2 + uVar14;
      prVar5 = prVar18 + -1;
      if (iVar7 == 0) {
        prVar5 = prVar16;
      }
      uVar17 = prVar5->m_bits[0x10];
      if (uVar17 == '\0') {
        return true;
      }
      uVar11 = (ulong)(iVar7 - 1);
      if (iVar7 == 0) {
        uVar11 = (ulong)uVar12;
      }
      do {
        while( true ) {
          uVar10 = uVar11;
          prVar4 = prVar5;
          uVar12 = (uint)(*(int *)prVar4->m_bits * -0x61c88647) >> (uVar1 & 0x1f);
          iVar8 = (int)uVar10;
          iVar7 = (int)uVar9;
          if (((int)uVar12 < iVar8) || (iVar7 <= (int)uVar12)) break;
LAB_001210ec:
          prVar5 = prVar4 + -1;
          if (iVar8 == 0) {
            prVar5 = prVar16;
          }
          uVar11 = (ulong)(iVar8 - 1);
          if (iVar8 == 0) {
            uVar11 = uVar14;
          }
          uVar17 = prVar5->m_bits[0x10];
          if (uVar17 == '\0') {
            return true;
          }
        }
        if ((iVar7 < iVar8) && ((int)uVar12 < iVar7 || iVar8 <= (int)uVar12)) goto LAB_001210ec;
        *(int *)prVar18->m_bits = *(int *)prVar4->m_bits;
        *(undefined8 *)(prVar18->m_bits + 8) = *(undefined8 *)(prVar4->m_bits + 8);
        prVar18->m_bits[0x10] = uVar17;
        prVar4->m_bits[0x10] = '\0';
        uVar13 = (this->TheMap).m_values_count - 1;
        uVar14 = (ulong)uVar13;
        uVar12 = iVar8 - 1;
        if (iVar8 == 0) {
          uVar12 = uVar13;
        }
        prVar16 = prVar2 + uVar14;
        prVar5 = prVar4 + -1;
        if (iVar8 == 0) {
          prVar5 = prVar16;
        }
        uVar17 = prVar5->m_bits[0x10];
        uVar11 = (ulong)uVar12;
        uVar9 = uVar10;
        prVar18 = prVar4;
        if (uVar17 == '\0') {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

inline int find_index(const Key& k) const
    {
        if (m_num_valid)
        {
            unsigned index = hash_key(k);
            const node* pNode = get_node(index);

            if (pNode->state)
            {
                if (pNode->first == k) {
                    return index;
                }

                const unsigned orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values_count - 1;
                        pNode = get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (index == orig_index) {
                        break;
                    }

                    if (!pNode->state) {
                        break;
                    }

                    if (pNode->first == k) {
                        return index;
                    }
                }
            }
        }

        return -1; // Not found
    }